

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O1

Vec3f __thiscall Raytracer::Camera::WorldToCamera(Camera *this,Vec3f *pos,Image *image)

{
  float fVar1;
  int iVar2;
  long in_RCX;
  double dVar3;
  undefined8 extraout_XMM0_Qa;
  float fVar4;
  Vec3f VVar5;
  
  iVar2 = *(int *)(in_RCX + 8);
  fVar1 = *(float *)&image->datas;
  fVar4 = *(float *)((long)&image->datas + 4) - (float)(*(int *)(in_RCX + 0xc) / 2);
  dVar3 = tan((double)(pos[1].x * 0.5));
  (this->origin).x = fVar1 - (float)(iVar2 / 2);
  (this->origin).y = fVar4;
  (this->origin).z = (float)((double)-iVar2 / (dVar3 + dVar3));
  Vec3<float>::normalize(&this->origin);
  VVar5.z = fVar4;
  VVar5.x = (float)(int)extraout_XMM0_Qa;
  VVar5.y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  return VVar5;
}

Assistant:

Vec3f Raytracer::Camera::WorldToCamera(const Vec3f &pos ,const Raytracer::Image& image) const{

    float x = pos.x-(image.width/2);
    float y  = pos.y-(image.height/2);
    float z = -image.width / (2 * tan(fov /2));
    Vec3f direction(x, y, z);
    direction.normalize();
    return direction;

}